

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.c
# Opt level: O1

int mbedtls_base64_encode(uchar *dst,size_t dlen,size_t *olen,uchar *src,size_t slen)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  undefined1 auVar4 [16];
  uchar uVar5;
  int iVar6;
  ulong uVar7;
  uchar *puVar8;
  uint uVar9;
  
  if (slen == 0) {
    *olen = 0;
LAB_00225e71:
    iVar6 = 0;
  }
  else {
    auVar4._8_8_ = 0;
    auVar4._0_8_ = slen;
    uVar7 = (ulong)(0x5555555555555555 < SUB168(auVar4 * ZEXT816(0xaaaaaaaaaaaaaaab),0)) + slen / 3;
    if (uVar7 >> 0x3e == 0) {
      uVar7 = uVar7 * 4;
      if ((dst != (uchar *)0x0) && (uVar7 < dlen)) {
        puVar8 = dst;
        if (slen < 3) {
          uVar7 = 0;
        }
        else {
          uVar7 = 0;
          do {
            bVar3 = src[uVar7];
            bVar1 = src[uVar7 + 1];
            bVar2 = src[uVar7 + 2];
            uVar5 = mbedtls_ct_base64_enc_char(bVar3 >> 2);
            *puVar8 = uVar5;
            uVar5 = mbedtls_ct_base64_enc_char((bVar3 & 3) << 4 | bVar1 >> 4);
            puVar8[1] = uVar5;
            uVar5 = mbedtls_ct_base64_enc_char(bVar2 >> 6 | (bVar1 & 0xf) << 2);
            puVar8[2] = uVar5;
            uVar5 = mbedtls_ct_base64_enc_char(bVar2 & 0x3f);
            puVar8[3] = uVar5;
            puVar8 = puVar8 + 4;
            uVar7 = uVar7 + 3;
          } while (uVar7 < (slen / 3) * 3);
          src = src + uVar7;
        }
        if (uVar7 < slen) {
          bVar3 = *src;
          uVar9 = 0;
          if (uVar7 + 1 < slen) {
            uVar9 = (uint)src[1];
          }
          uVar5 = mbedtls_ct_base64_enc_char(bVar3 >> 2);
          *puVar8 = uVar5;
          uVar5 = mbedtls_ct_base64_enc_char((byte)(uVar9 >> 4) | (bVar3 & 3) << 4);
          puVar8[1] = uVar5;
          uVar5 = '=';
          if (uVar7 + 1 < slen) {
            uVar5 = mbedtls_ct_base64_enc_char(((byte)uVar9 & 0xf) << 2);
          }
          puVar8[2] = uVar5;
          puVar8[3] = '=';
          puVar8 = puVar8 + 4;
        }
        *olen = (long)puVar8 - (long)dst;
        *puVar8 = '\0';
        goto LAB_00225e71;
      }
      *olen = uVar7 | 1;
    }
    else {
      *olen = 0xffffffffffffffff;
    }
    iVar6 = -0x2a;
  }
  return iVar6;
}

Assistant:

int mbedtls_base64_encode(unsigned char *dst, size_t dlen, size_t *olen,
                          const unsigned char *src, size_t slen)
{
    size_t i, n;
    int C1, C2, C3;
    unsigned char *p;

    if (slen == 0) {
        *olen = 0;
        return 0;
    }

    n = slen / 3 + (slen % 3 != 0);

    if (n > (SIZE_MAX - 1) / 4) {
        *olen = SIZE_MAX;
        return MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL;
    }

    n *= 4;

    if ((dlen < n + 1) || (NULL == dst)) {
        *olen = n + 1;
        return MBEDTLS_ERR_BASE64_BUFFER_TOO_SMALL;
    }

    n = (slen / 3) * 3;

    for (i = 0, p = dst; i < n; i += 3) {
        C1 = *src++;
        C2 = *src++;
        C3 = *src++;

        *p++ = mbedtls_ct_base64_enc_char((C1 >> 2) & 0x3F);
        *p++ = mbedtls_ct_base64_enc_char((((C1 &  3) << 4) + (C2 >> 4))
                                          & 0x3F);
        *p++ = mbedtls_ct_base64_enc_char((((C2 & 15) << 2) + (C3 >> 6))
                                          & 0x3F);
        *p++ = mbedtls_ct_base64_enc_char(C3 & 0x3F);
    }

    if (i < slen) {
        C1 = *src++;
        C2 = ((i + 1) < slen) ? *src++ : 0;

        *p++ = mbedtls_ct_base64_enc_char((C1 >> 2) & 0x3F);
        *p++ = mbedtls_ct_base64_enc_char((((C1 & 3) << 4) + (C2 >> 4))
                                          & 0x3F);

        if ((i + 1) < slen) {
            *p++ = mbedtls_ct_base64_enc_char(((C2 & 15) << 2) & 0x3F);
        } else {
            *p++ = '=';
        }

        *p++ = '=';
    }

    *olen = p - dst;
    *p = 0;

    return 0;
}